

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O1

ZyanStatus ZydisDecoderEnableMode(ZydisDecoder *decoder,ZydisDecoderMode mode,ZyanBool enabled)

{
  ZyanStatus ZVar1;
  uint uVar2;
  
  ZVar1 = 0x80100004;
  if (mode < (ZYDIS_DECODER_MODE_MAX_VALUE|ZYDIS_DECODER_MODE_AMD_BRANCHES) &&
      decoder != (ZydisDecoder *)0x0) {
    uVar2 = 1 << ((byte)mode & 0x1f);
    if (enabled == '\0') {
      decoder->decoder_mode = decoder->decoder_mode & ~uVar2;
    }
    else {
      decoder->decoder_mode = decoder->decoder_mode | uVar2;
    }
    ZVar1 = 0x100000;
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZydisDecoderEnableMode(ZydisDecoder* decoder, ZydisDecoderMode mode, ZyanBool enabled)
{
    if (!decoder || ((ZyanUSize)mode > ZYDIS_DECODER_MODE_MAX_VALUE))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

#ifdef ZYDIS_MINIMAL_MODE
    if ((mode == ZYDIS_DECODER_MODE_MINIMAL) && !enabled)
    {
        return ZYAN_STATUS_INVALID_OPERATION;
    }
#endif

    if (enabled)
    {
        decoder->decoder_mode |= (1 << mode);
    }
    else
    {
        decoder->decoder_mode &= ~(1 << mode);
    }

    return ZYAN_STATUS_SUCCESS;
}